

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexTriangleKernel.h
# Opt level: O2

void __thiscall Ptex::v2_2::PtexTriangleKernel::reorient(PtexTriangleKernel *this,int eid,int aeid)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  uint uVar18;
  float fVar19;
  float fVar20;
  
  uVar18 = eid * 3 + aeid;
  if (uVar18 < 9) {
    fVar1 = this->u;
    fVar2 = this->v;
    fVar19 = 1.0 - fVar1;
    fVar20 = fVar19 - fVar2;
    switch(uVar18) {
    case 0:
      fVar1 = this->u1;
      fVar20 = this->v1;
      fVar3 = this->w1;
      this->u = fVar19;
      this->v = -fVar2;
      this->u1 = 1.0 - this->u2;
      this->v1 = -this->v2;
      this->w1 = 1.0 - this->w2;
      this->u2 = 1.0 - fVar1;
      this->v2 = -fVar20;
      this->w2 = 1.0 - fVar3;
      return;
    case 1:
      fVar3 = this->w1;
      fVar1 = this->u1;
      fVar2 = this->v1;
      this->u = 1.0 - fVar20;
      this->v = fVar19;
      this->u1 = 1.0 - this->w2;
      this->v1 = 1.0 - this->u2;
      this->w1 = -this->v2;
      this->u2 = 1.0 - fVar3;
      this->v2 = 1.0 - fVar1;
      this->w2 = -fVar2;
      rotate1(this);
      return;
    case 2:
      fVar1 = this->u1;
      fVar19 = this->v1;
      fVar3 = this->w1;
      this->u = -fVar2;
      this->v = 1.0 - fVar20;
      this->u1 = -this->v2;
      this->v1 = 1.0 - this->w2;
      this->w1 = 1.0 - this->u2;
      this->u2 = -fVar19;
      this->v2 = 1.0 - fVar3;
      this->w2 = 1.0 - fVar1;
      rotate2(this);
      return;
    case 3:
      fVar1 = this->v1;
      fVar19 = this->w1;
      fVar3 = this->u1;
      this->u = 1.0 - fVar2;
      this->v = -fVar20;
      this->u1 = 1.0 - this->v2;
      this->v1 = -this->w2;
      this->w1 = 1.0 - this->u2;
      this->u2 = 1.0 - fVar1;
      this->v2 = -fVar19;
      this->w2 = 1.0 - fVar3;
      rotate2(this);
      return;
    case 4:
      fVar1 = this->w1;
      this->u = fVar19;
      this->w1 = -this->w2;
      uVar4 = this->u1;
      uVar11 = this->v1;
      this->v = 1.0 - fVar2;
      this->u1 = 1.0 - this->u2;
      this->v1 = 1.0 - this->v2;
      this->u2 = 1.0 - (float)uVar4;
      this->v2 = 1.0 - (float)uVar11;
      this->w2 = -fVar1;
      return;
    case 5:
      this->u = -fVar20;
      this->v = fVar19;
      uVar7 = this->u2;
      uVar14 = this->v2;
      this->u2 = -this->w1;
      uVar8 = this->u1;
      uVar15 = this->v1;
      this->u1 = -this->w2;
      this->v1 = 1.0 - (float)uVar7;
      this->w1 = 1.0 - (float)uVar14;
      this->v2 = 1.0 - (float)uVar8;
      this->w2 = 1.0 - (float)uVar15;
      rotate1(this);
      return;
    case 6:
      fVar2 = this->u1;
      fVar19 = this->w1;
      fVar3 = this->v1;
      this->u = 1.0 - fVar20;
      this->v = -fVar1;
      this->u1 = 1.0 - this->w2;
      this->v1 = -this->u2;
      this->w1 = 1.0 - this->v2;
      this->u2 = 1.0 - fVar19;
      this->v2 = -fVar2;
      this->w2 = 1.0 - fVar3;
      rotate1(this);
      return;
    case 7:
      fVar1 = this->u1;
      uVar5 = this->v2;
      uVar12 = this->w2;
      uVar6 = this->v1;
      uVar13 = this->w1;
      this->u = 1.0 - fVar2;
      this->v = 1.0 - fVar20;
      this->u1 = 1.0 - (float)uVar5;
      this->v1 = 1.0 - (float)uVar12;
      this->w1 = -this->u2;
      this->u2 = 1.0 - (float)uVar6;
      this->v2 = 1.0 - (float)uVar13;
      this->w2 = -fVar1;
      rotate2(this);
      return;
    case 8:
      fVar19 = this->u1;
      this->u = -fVar1;
      this->v = 1.0 - fVar2;
      this->u1 = -this->u2;
      uVar9 = this->v2;
      uVar16 = this->w2;
      this->u2 = -fVar19;
      uVar10 = this->v1;
      uVar17 = this->w1;
      this->v1 = 1.0 - (float)uVar9;
      this->w1 = 1.0 - (float)uVar16;
      this->v2 = 1.0 - (float)uVar10;
      this->w2 = 1.0 - (float)uVar17;
    }
  }
  return;
}

Assistant:

void reorient(int eid, int aeid)
    {
        float w = 1.0f-u-v;

#define C(eid, aeid) (eid*3 + aeid)
        switch (C(eid, aeid)) {
        case C(0, 0): set(1.0f-u, -v, 1.0f-u2, -v2, 1.0f-w2, 1.0f-u1, -v1, 1.0f-w1); break;
        case C(0, 1): set(1.0f-w, 1.0f-u, 1.0f-w2, 1.0f-u2, -v2, 1.0f-w1, 1.0f-u1, -v1); rotate1(); break;
        case C(0, 2): set( -v, 1.0f-w, -v2, 1.0f-w2, 1.0f-u2, -v1, 1.0f-w1, 1.0f-u1); rotate2(); break;

        case C(1, 0): set(1.0f-v, -w, 1.0f-v2, -w2, 1.0f-u2, 1.0f-v1, -w1, 1.0f-u1); rotate2(); break;
        case C(1, 1): set(1.0f-u, 1.0f-v, 1.0f-u2, 1.0f-v2, -w2, 1.0f-u1, 1.0f-v1, -w1); break;
        case C(1, 2): set( -w, 1.0f-u, -w2, 1.0f-u2, 1.0f-v2, -w1, 1.0f-u1, 1.0f-v1); rotate1(); break;

        case C(2, 0): set(1.0f-w, -u, 1.0f-w2, -u2, 1.0f-v2, 1.0f-w1, -u1, 1.0f-v1); rotate1(); break;
        case C(2, 1): set(1.0f-v, 1.0f-w, 1.0f-v2, 1.0f-w2, -u2, 1.0f-v1, 1.0f-w1, -u1); rotate2(); break;
        case C(2, 2): set( -u, 1.0f-v, -u2, 1.0f-v2, 1.0f-w2, -u1, 1.0f-v1, 1.0f-w1); break;
#undef C
        }
    }